

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  pid_t pVar3;
  TestResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int *streamable;
  int *piVar4;
  DeathTestImpl *in_RDI;
  int in_stack_0000015c;
  char **in_stack_00000160;
  int gtest_retval;
  pid_t child_pid;
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string internal_flag;
  string filter_flag;
  int pipe_fd [2];
  int death_test_index;
  TestInfo *info;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> *in_stack_fffffffffffff9b0;
  char *__rhs;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  allocator<char> *in_stack_fffffffffffff9d0;
  allocator<char> *__a;
  int *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9f8;
  char local_5c9 [225];
  int local_4e8;
  pid_t local_4e4;
  allocator<char> local_4d1;
  string local_4d0 [56];
  string local_498 [32];
  string local_478 [32];
  string local_458 [39];
  allocator<char> local_431;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [39];
  undefined1 local_2e9 [33];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [36];
  undefined4 local_224;
  undefined4 local_134;
  int local_34;
  int local_30;
  int local_2c;
  TestInfo *local_28;
  InternalRunDeathTestFlag *local_20;
  UnitTestImpl *local_18;
  TestRole local_4;
  
  local_18 = GetUnitTestImpl();
  local_20 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x128696);
  local_28 = UnitTestImpl::current_test_info(local_18);
  this_00 = TestInfo::result(local_28);
  local_2c = TestResult::death_test_count(this_00);
  if (local_20 == (InternalRunDeathTestFlag *)0x0) {
    do {
      iVar2 = pipe(&local_34);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8,
                   in_stack_fffffffffffff9d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        local_134 = 0x555;
        StreamableToString<int>(in_stack_fffffffffffff9d8);
        std::operator+(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        DeathTestAbort((string *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    do {
      iVar2 = fcntl(local_30,2,0);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8,
                   in_stack_fffffffffffff9d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        local_224 = 0x558;
        StreamableToString<int>(in_stack_fffffffffffff9d8);
        std::operator+(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                       (char *)in_stack_fffffffffffff9b0);
        DeathTestAbort((string *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0
              );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              TestInfo::test_suite_name((TestInfo *)0x128c27);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    streamable = (int *)TestInfo::name((TestInfo *)0x128c75);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string((string *)(local_2e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2e9);
    __a = &local_431;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)streamable,__a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    StreamableToString<int>(streamable);
    std::operator+(__lhs,this_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    StreamableToString<int>(streamable);
    std::operator+(__lhs,this_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   (char *)in_stack_fffffffffffff9b0);
    StreamableToString<int>(streamable);
    std::operator+(__lhs,this_01);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator(&local_431);
    GetArgvsForDeathTestChildProcess_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                (value_type *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                (value_type *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)streamable,__a);
    DeathTest::set_last_death_test_message((string *)0x128f8c);
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    CaptureStderr();
    FlushInfoLog();
    CreateArgvFromArgs(in_stack_fffffffffffff9f8);
    std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::get(in_stack_fffffffffffff9b0);
    pVar3 = ExecDeathTestSpawnChild(in_stack_00000160,in_stack_0000015c);
    local_4e4 = pVar3;
    do {
      do {
        iVar2 = close(local_30);
        uVar5 = false;
        local_4e8 = iVar2;
        if (iVar2 == -1) {
          piVar4 = __errno_location();
          uVar5 = *piVar4 == 4;
        }
      } while ((bool)uVar5 != false);
      if (local_4e8 == -1) {
        __rhs = local_5c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)streamable,__a);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffff9b8),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffff9b8),__rhs);
        StreamableToString<int>(streamable);
        std::operator+(__lhs,this_01);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffff9b8),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffff9b8),__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar5,in_stack_fffffffffffff9b8),__rhs);
        DeathTestAbort((string *)CONCAT44(pVar3,iVar2));
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    ForkingDeathTest::set_child_pid((ForkingDeathTest *)in_RDI,local_4e4);
    DeathTestImpl::set_read_fd(in_RDI,local_34);
    DeathTestImpl::set_spawned(in_RDI,true);
    local_4 = OVERSEE_TEST;
    std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::~unique_ptr
              (in_stack_fffffffffffff9b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(pVar3,iVar2));
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_248);
  }
  else {
    iVar2 = InternalRunDeathTestFlag::write_fd(local_20);
    DeathTestImpl::set_write_fd(in_RDI,iVar2);
    local_4 = EXECUTE_TEST;
  }
  return local_4;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}